

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringText.cpp
# Opt level: O3

void __thiscall oout::StringText::StringText(StringText *this,string *value)

{
  pointer pcVar1;
  
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__StringText_00120b28;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + value->_M_string_length);
  return;
}

Assistant:

StringText::StringText(const string &value)
	: value(value)
{
}